

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateActivation
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  bool bVar1;
  ActivationParams *pAVar2;
  Result *_result;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    this_00 = &__return_storage_ptr__->m_message;
    std::__cxx11::string::~string((string *)this_00);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)this_00);
      if (this->ndArrayInterpretation == true) {
        pAVar2 = Specification::NeuralNetworkLayer::activation(layer);
        if (pAVar2->_oneof_case_[0] == 0x19) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_48,"ActivationPReLU",(allocator<char> *)&local_88);
          validateInputOutputRankEquality
                    (__return_storage_ptr__,layer,&local_48,&this->blobNameToRank);
          std::__cxx11::string::~string((string *)&local_48);
          bVar1 = Result::good(__return_storage_ptr__);
          if (!bVar1) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::~string((string *)this_00);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,"ActivationPReLU",&local_89);
          validateRankCount(__return_storage_ptr__,layer,&local_88,3,-1,&this->blobNameToRank);
          std::__cxx11::string::~string((string *)&local_88);
          bVar1 = Result::good(__return_storage_ptr__);
          if (!bVar1) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::~string((string *)this_00);
        }
        pAVar2 = Specification::NeuralNetworkLayer::activation(layer);
        if (pAVar2->_oneof_case_[0] == 0x47) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"ActivationParametricSoftplus",(allocator<char> *)&local_88
                    );
          validateInputOutputRankEquality
                    (__return_storage_ptr__,layer,&local_68,&this->blobNameToRank);
          std::__cxx11::string::~string((string *)&local_68);
          bVar1 = Result::good(__return_storage_ptr__);
          if (!bVar1) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::~string((string *)this_00);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,"ActivationParametricSoftplus",&local_89);
          validateRankCount(__return_storage_ptr__,layer,&local_88,3,-1,&this->blobNameToRank);
          std::__cxx11::string::~string((string *)&local_88);
          bVar1 = Result::good(__return_storage_ptr__);
          if (!bVar1) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::~string((string *)this_00);
        }
      }
      pAVar2 = Specification::NeuralNetworkLayer::activation(layer);
      validateActivationParams(__return_storage_ptr__,pAVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateActivation(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        if (layer.activation().NonlinearityType_case() == Specification::ActivationParams::NonlinearityTypeCase::kPReLU) {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ActivationPReLU", blobNameToRank));
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "ActivationPReLU", 3, -1, blobNameToRank));
        }

        if (layer.activation().NonlinearityType_case() == Specification::ActivationParams::NonlinearityTypeCase::kParametricSoftplus) {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ActivationParametricSoftplus", blobNameToRank));
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "ActivationParametricSoftplus", 3, -1, blobNameToRank));
        }
    }

    return validateActivationParams(layer.activation());
}